

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O0

void __thiscall llama_file::impl::impl(impl *this,char *fname,char *mode)

{
  long lVar1;
  runtime_error *this_00;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  string local_38 [8];
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  size_t in_stack_ffffffffffffffd8;
  impl *in_stack_ffffffffffffffe0;
  
  lVar1 = ggml_fopen(in_RSI,in_RDX);
  *in_RDI = lVar1;
  if (*in_RDI == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    format_abi_cxx11_((char *)local_38,"failed to open %s: %s",in_RSI,pcVar3);
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  seek(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  sVar4 = tell((impl *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  in_RDI[1] = sVar4;
  seek(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  return;
}

Assistant:

impl(const char * fname, const char * mode) {
        fp = ggml_fopen(fname, mode);
        if (fp == NULL) {
            throw std::runtime_error(format("failed to open %s: %s", fname, strerror(errno)));
        }
        seek(0, SEEK_END);
        size = tell();
        seek(0, SEEK_SET);
    }